

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O3

void __thiscall
unodb::qsbr::register_dealloc_stats_per_thread_between_epoch_changes
          (qsbr *this,size_t total_size,size_t count)

{
  int iVar1;
  flat_like_arg_list<boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::accumulator,_boost::parameter::aux::tagged_argument<boost::accumulators::tag::accumulator,_boost::accumulators::accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>_>,_std::integral_constant<bool,_true>_>,_boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::sample,_boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>,_std::integral_constant<bool,_true>_>_>
  local_48;
  accumulator_visitor<boost::parameter::aux::flat_like_arg_list<boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::accumulator,_boost::parameter::aux::tagged_argument<boost::accumulators::tag::accumulator,_boost::accumulators::accumulator_set<unsigned_long,_boost::accumulators::stats<boost::accumulators::tag::max,_boost::accumulators::tag::variance,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_void>_>,_std::integral_constant<bool,_true>_>,_boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::sample,_boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>,_std::integral_constant<bool,_true>_>_>_>
  local_38;
  size_t local_30;
  size_t total_size_local;
  size_t count_local;
  
  local_30 = total_size;
  total_size_local = count;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->dealloc_stats_lock);
  if (iVar1 == 0) {
    local_48.super_type.arg.value = &this->deallocation_size_per_thread_stats;
    local_48.super_type.
    super_arg_list<boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>,_boost::parameter::aux::empty_arg_list,_std::integral_constant<bool,_true>_>
    .arg.value = (tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>)&local_30;
    local_38.args = &local_48;
    boost::accumulators::
    accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
    ::
    visit<boost::accumulators::detail::accumulator_visitor<boost::parameter::aux::flat_like_arg_list<boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::accumulator,boost::parameter::aux::tagged_argument<boost::accumulators::tag::accumulator,boost::accumulators::accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>>,std::integral_constant<bool,true>>,boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::sample,boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,unsigned_long_const>,std::integral_constant<bool,true>>>>>
              ((accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                *)local_48.super_type.arg.value,&local_38);
    (this->deallocation_size_per_thread_max).super___atomic_base<unsigned_long>._M_i =
         (this->deallocation_size_per_thread_stats).accumulators.car.super_max_impl<unsigned_long>.
         max_;
    (this->deallocation_size_per_thread_mean).super___atomic_float<double>._M_fp =
         (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.car.
         super_immediate_mean_impl<unsigned_long,_boost::accumulators::tag::sample>.mean;
    (this->deallocation_size_per_thread_variance).super___atomic_float<double>._M_fp =
         (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.cdr.car.
         super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
         .variance;
    local_48.super_type.arg.value = &this->epoch_dealloc_per_thread_count_stats;
    local_48.super_type.
    super_arg_list<boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>,_boost::parameter::aux::empty_arg_list,_std::integral_constant<bool,_true>_>
    .arg.value = (tagged_argument<boost::accumulators::tag::sample,_const_unsigned_long>)
                 &total_size_local;
    local_38.args = &local_48;
    boost::accumulators::
    accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
    ::
    visit<boost::accumulators::detail::accumulator_visitor<boost::parameter::aux::flat_like_arg_list<boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::accumulator,boost::parameter::aux::tagged_argument<boost::accumulators::tag::accumulator,boost::accumulators::accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>>,std::integral_constant<bool,true>>,boost::parameter::aux::flat_like_arg_tuple<boost::accumulators::tag::sample,boost::parameter::aux::tagged_argument<boost::accumulators::tag::sample,unsigned_long_const>,std::integral_constant<bool,true>>>>>
              ((accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                *)local_48.super_type.arg.value,&local_38);
    (this->epoch_dealloc_per_thread_count_max).super___atomic_base<unsigned_long>._M_i =
         (this->epoch_dealloc_per_thread_count_stats).accumulators.car.super_max_impl<unsigned_long>
         .max_;
    (this->epoch_dealloc_per_thread_count_variance).super___atomic_float<double>._M_fp =
         (this->epoch_dealloc_per_thread_count_stats).accumulators.cdr.cdr.cdr.car.
         super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
         .variance;
    pthread_mutex_unlock((pthread_mutex_t *)&this->dealloc_stats_lock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void register_dealloc_stats_per_thread_between_epoch_changes(
      std::size_t total_size, std::size_t count) {
    const std::lock_guard guard{dealloc_stats_lock};
    deallocation_size_per_thread_stats(total_size);
    publish_deallocation_size_stats();
    epoch_dealloc_per_thread_count_stats(count);
    publish_epoch_callback_stats();
  }